

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall
SimpleLoggerMgr::_flushStackTraceBuffer
          (SimpleLoggerMgr *this,size_t buffer_len,uint32_t tid_hash,uint64_t kernel_tid,
          bool crash_origin)

{
  size_type sVar1;
  char cVar2;
  ostream *poVar3;
  size_t ii;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string msg;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char temp_buf [256];
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  snprintf(temp_buf,0x100,"\nThread %04x",tid_hash);
  std::__cxx11::string::append((char *)&msg);
  if (kernel_tid != 0) {
    std::__cxx11::to_string(&local_178,kernel_tid);
    std::operator+(&local_158," (",&local_178);
    std::operator+(&local_1b8,&local_158,")");
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  if (crash_origin) {
    std::__cxx11::string::append((char *)&msg);
  }
  std::__cxx11::string::append((char *)&msg);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,this->stackTraceBuffer,this->stackTraceBuffer + buffer_len);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_1b8);
  sVar1 = msg._M_string_length;
  for (uVar4 = 0; uVar4 < sVar1; uVar4 = uVar4 + 0xc00) {
    std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&msg);
    flushAllLoggers(this,2,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    poVar3 = std::operator<<((ostream *)&this->crashDumpFile,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void SimpleLoggerMgr::_flushStackTraceBuffer(size_t buffer_len,
                                             uint32_t tid_hash,
                                             uint64_t kernel_tid,
                                             bool crash_origin)
{
    std::string msg;
    char temp_buf[256];
    snprintf(temp_buf, 256, "\nThread %04x", tid_hash);
    msg += temp_buf;
    if (kernel_tid) {
        msg += " (" + std::to_string(kernel_tid) + ")";
    }
    if (crash_origin) {
        msg += " (crashed here)";
    }
    msg += "\n\n";
    msg += std::string(stackTraceBuffer, buffer_len);

    size_t msg_len = msg.size();
    size_t per_log_size = SimpleLogger::MSG_SIZE - 1024;
    for (size_t ii=0; ii<msg_len; ii+=per_log_size) {
        flushAllLoggers(2, msg.substr(ii, per_log_size));
    }

    if (crashDumpFile.is_open()) {
        crashDumpFile << msg << std::endl;
    }
}